

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Parser::extractBracketArguments
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Parser *this,string *data)

{
  char cVar1;
  pointer pbVar2;
  char *pcVar3;
  string *this_00;
  uint uVar4;
  uint uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int iVar6;
  uint uVar7;
  uint uVar8;
  pointer pbVar9;
  allocator local_51;
  string argumentBuffer;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argumentBuffer._M_dataplus._M_p = (pointer)&argumentBuffer.field_2;
  argumentBuffer._M_string_length = 0;
  argumentBuffer.field_2._M_local_buf[0] = '\0';
  pcVar3 = (data->_M_dataplus)._M_p;
  if (*pcVar3 == '(') {
    std::__cxx11::string::erase((ulong)data,0);
    pcVar3 = (data->_M_dataplus)._M_p;
  }
  if (pcVar3[data->_M_string_length - 1] == ')') {
    std::__cxx11::string::erase((ulong)data,data->_M_string_length - 1);
  }
  iVar6 = 0;
  uVar7 = 0;
  uVar4 = 0;
  do {
    if (data->_M_string_length <= (ulong)uVar7) {
      if (argumentBuffer._M_string_length != 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&argumentBuffer);
      }
      pbVar2 = (__return_storage_ptr__->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar9 = (__return_storage_ptr__->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar2;
          pbVar9 = pbVar9 + 1) {
        while (*(pbVar9->_M_dataplus)._M_p == ' ') {
          std::__cxx11::string::erase((ulong)pbVar9,0);
        }
        while ((pbVar9->_M_dataplus)._M_p[pbVar9->_M_string_length - 1] == ' ') {
          std::__cxx11::string::erase((ulong)pbVar9,pbVar9->_M_string_length - 1);
        }
      }
      std::__cxx11::string::~string((string *)&argumentBuffer);
      return __return_storage_ptr__;
    }
    cVar1 = (data->_M_dataplus)._M_p[uVar7];
    uVar5 = (uint)(~(byte)uVar4 & 1);
    uVar8 = uVar4;
    if (cVar1 == '\"') {
      uVar8 = uVar5;
    }
    if (cVar1 == '(') {
      iVar6 = iVar6 + uVar5;
LAB_0010bd89:
      std::__cxx11::string::push_back((char)&argumentBuffer);
    }
    else {
      if (cVar1 == ')') {
        if (uVar4 == 0) {
          if (iVar6 < 1) {
            this_00 = (string *)__cxa_allocate_exception(0x20);
            std::__cxx11::string::string(this_00,"Bracket mismatch",&local_51);
            __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          iVar6 = iVar6 + -1;
        }
        goto LAB_0010bd89;
      }
      if ((((cVar1 != ',') || (argumentBuffer._M_string_length == 0)) || (iVar6 != 0)) ||
         (uVar4 != 0)) goto LAB_0010bd89;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&argumentBuffer);
      argumentBuffer._M_string_length = 0;
      *argumentBuffer._M_dataplus._M_p = '\0';
      iVar6 = 0;
    }
    uVar7 = uVar7 + 1;
    uVar4 = uVar8;
  } while( true );
}

Assistant:

std::vector<std::string> Parser::extractBracketArguments(std::string data)
{
    std::vector<std::string> arguments;
    std::string argumentBuffer;
    bool isQuoteOpen = false;
    int bracketDepth = 0;

    //Take off surrounding brackets if any as these aren't needed in the split results
    if(data[0] == '(')
        data.erase(0,1);
    if(data[data.size()-1] == ')')
        data.erase(data.size()-1, 1);

    //Go through each character and split each argument into a separate vector element
    for(unsigned int c = 0; c < data.size(); c++) //Ignore opening and close brackets
    {
        if(data[c] == '"')
            isQuoteOpen = !isQuoteOpen;
        if(data[c] == '(' && !isQuoteOpen)
            bracketDepth++;
        else if(data[c] == ')' && !isQuoteOpen)
            bracketDepth--;
        if(bracketDepth < 0)
            throw std::string("Bracket mismatch");
        if(data[c] == ',' && !argumentBuffer.empty() && !isQuoteOpen && bracketDepth == 0)
        {
            arguments.emplace_back(argumentBuffer);
            argumentBuffer.clear();
        }
        else
        {
            argumentBuffer += data[c];
        }
    }
    if(!argumentBuffer.empty())
        arguments.emplace_back(argumentBuffer);

    //Fix the spacing
    for(auto &arg : arguments)
    {
        while(arg[0] == ' ')
            arg.erase(0,1);
        while(arg[arg.size()-1] == ' ')
            arg.erase(arg.size()-1, 1);
    }

    return arguments;
}